

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_base.c
# Opt level: O0

void set_intra_pred_penalties(Vp8eHwCfg *hw_cfg,RK_U32 qp)

{
  int local_18;
  RK_S32 tmp;
  RK_S32 i;
  RK_U32 qp_local;
  Vp8eHwCfg *hw_cfg_local;
  
  for (local_18 = 0; local_18 < 10; local_18 = local_18 + 1) {
    hw_cfg->intra_b_mode_penalty[local_18] =
         (int)(intra4_mode_tree_penalty_tbl[local_18] * (qp * 2 + 8)) >> 8;
  }
  for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
    hw_cfg->intra_mode_penalty[local_18] =
         (int)(intra16_mode_tree_penalty_tbl[local_18] * (qp * 2 + 0x40)) >> 8;
  }
  if (hw_cfg->intra_16_favor == -1) {
    hw_cfg->intra_16_favor = (qp << 10) >> 7;
  }
  return;
}

Assistant:

static void set_intra_pred_penalties(Vp8eHwCfg *hw_cfg, RK_U32 qp)
{
    RK_S32 i, tmp;

    /* Intra 4x4 mode */
    tmp = qp * 2 + 8;
    for (i = 0; i < 10; i++) {
        hw_cfg->intra_b_mode_penalty[i] = (intra4_mode_tree_penalty_tbl[i] * tmp) >> 8;
    }

    /* Intra 16x16 mode */
    tmp = qp * 2 + 64;
    for (i = 0; i < 4; i++) {
        hw_cfg->intra_mode_penalty[i] = (intra16_mode_tree_penalty_tbl[i] * tmp) >> 8;
    }

    /* If favor has not been set earlier by testId use default */
    if (hw_cfg->intra_16_favor == -1)
        hw_cfg->intra_16_favor = qp * 1024 / 128;
}